

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::AdvancedFP64Case1::Run(AdvancedFP64Case1 *this)

{
  CallLogWrapper *this_00;
  GLuint *buffers;
  AdvancedFP64Case1 *pAVar1;
  bool bVar2;
  GLuint GVar3;
  GLint location;
  long lVar4;
  bool *compile_error;
  int iVar5;
  int i;
  ulong uVar6;
  GLuint *buffers_00;
  double *pdVar7;
  allocator<char> local_59;
  AdvancedFP64Case1 *local_58;
  GLdouble data;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,
             "\nlayout(local_size_x = 4) in;\nlayout(std140, binding = 0) buffer ShaderStorageBlock {\n  double data;\n} g_shader_storage[4];\nlayout(std140, binding = 0) uniform UniformBlock {\n  double data;\n} g_uniform[2];\nuniform dvec2 g_uniform_def;\n\nvoid main() {\n  if (gl_GlobalInvocationID.x == 0) {\n    g_shader_storage[0].data = floor(g_uniform[0].data + 0.1LF);\n  } else if (gl_GlobalInvocationID.x == 1) {\n    g_shader_storage[1].data = ceil(g_uniform[1].data + 0.2LF);\n  } else if (gl_GlobalInvocationID.x == 2) {\n    g_shader_storage[2].data = min(g_uniform_def[0] + 0.1LF, 1.0LF);\n  } else if (gl_GlobalInvocationID.x == 3) {\n    g_shader_storage[3].data = max(g_uniform_def[0], g_uniform_def.y);\n  }\n}"
             ,&local_59);
  GVar3 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,(string *)&data);
  this->m_program = GVar3;
  std::__cxx11::string::~string((string *)&data);
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
  bVar2 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  if (bVar2) {
    buffers_00 = this->m_storage_buffer;
    local_58 = this;
    glu::CallLogWrapper::glGenBuffers(this_00,4,buffers_00);
    lVar4 = 0;
    while (lVar4 != 4) {
      iVar5 = (int)(lVar4 + 1);
      data = (GLdouble)iVar5;
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,iVar5 - 1,buffers_00[lVar4]);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,8,&data,0x88e4);
      lVar4 = lVar4 + 1;
    }
    buffers = local_58->m_uniform_buffer;
    glu::CallLogWrapper::glGenBuffers(this_00,2,buffers);
    lVar4 = 0;
    while (pAVar1 = local_58, lVar4 != 2) {
      iVar5 = (int)(lVar4 + 1);
      data = (GLdouble)iVar5;
      glu::CallLogWrapper::glBindBufferBase(this_00,0x8a11,iVar5 - 1,buffers[lVar4]);
      glu::CallLogWrapper::glBufferData(this_00,0x8a11,8,&data,0x88e4);
      lVar4 = lVar4 + 1;
    }
    glu::CallLogWrapper::glUseProgram(this_00,local_58->m_program);
    location = glu::CallLogWrapper::glGetUniformLocation(this_00,pAVar1->m_program,"g_uniform_def");
    glu::CallLogWrapper::glUniform2d(this_00,location,1.0,2.0);
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    pdVar7 = (double *)&DAT_0168d150;
    for (uVar6 = 0; uVar6 != 4; uVar6 = uVar6 + 1) {
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,buffers_00[uVar6]);
      glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,8,&data);
      if ((data != *pdVar7) || (NAN(data) || NAN(*pdVar7))) {
        anon_unknown_0::Output("Data at index %d is %f should be %f.\n",uVar6 & 0xffffffff);
        return -(ulong)(uVar6 < 4);
      }
      pdVar7 = pdVar7 + 1;
    }
    lVar4 = 0;
  }
  else {
    lVar4 = -1;
  }
  return lVar4;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 4) in;" NL "layout(std140, binding = 0) buffer ShaderStorageBlock {" NL
			   "  double data;" NL "} g_shader_storage[4];" NL "layout(std140, binding = 0) uniform UniformBlock {" NL
			   "  double data;" NL "} g_uniform[2];" NL "uniform dvec2 g_uniform_def;" NL NL "void main() {" NL
			   "  if (gl_GlobalInvocationID.x == 0) {" NL
			   "    g_shader_storage[0].data = floor(g_uniform[0].data + 0.1LF);" // floor(1.1LF) == 1.0LF
			NL "  } else if (gl_GlobalInvocationID.x == 1) {" NL
			   "    g_shader_storage[1].data = ceil(g_uniform[1].data + 0.2LF);" // ceil(2.2LF) == 3.0LF
			NL "  } else if (gl_GlobalInvocationID.x == 2) {" NL
			   "    g_shader_storage[2].data = min(g_uniform_def[0] + 0.1LF, 1.0LF);" // min(1.1LF, 1.0LF) == 1.0LF
			NL "  } else if (gl_GlobalInvocationID.x == 3) {" NL
			   "    g_shader_storage[3].data = max(g_uniform_def[0], g_uniform_def.y);" // max(1.0LF, 2.0LF) == 2.0LF
			NL "  }" NL "}";
		m_program = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(4, m_storage_buffer);
		for (GLuint i = 0; i < 4; ++i)
		{
			const GLdouble data = static_cast<GLdouble>(i + 1);
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i, m_storage_buffer[i]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), &data, GL_STATIC_DRAW);
		}

		glGenBuffers(2, m_uniform_buffer);
		for (GLuint i = 0; i < 2; ++i)
		{
			const GLdouble data = static_cast<GLdouble>(i + 1);
			glBindBufferBase(GL_UNIFORM_BUFFER, i, m_uniform_buffer[i]);
			glBufferData(GL_UNIFORM_BUFFER, sizeof(data), &data, GL_STATIC_DRAW);
		}

		glUseProgram(m_program);
		glUniform2d(glGetUniformLocation(m_program, "g_uniform_def"), 1.0, 2.0);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		/* validate */
		{
			const GLdouble expected[4] = { 1.0, 3.0, 1.0, 2.0 };
			for (int i = 0; i < 4; ++i)
			{
				GLdouble data;
				glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[i]);
				glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), &data);
				if (data != expected[i])
				{
					Output("Data at index %d is %f should be %f.\n", i, data, expected[i]);
					return ERROR;
				}
			}
		}
		return NO_ERROR;
	}